

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdGetPsbtUtxoData(void *handle,void *psbt_handle,char *txid,uint32_t vout,int64_t *amount,
                      char **locking_script,char **redeem_script,char **descriptor,
                      char **full_tx_hex)

{
  bool bVar1;
  undefined8 uVar2;
  uint32_t in_ECX;
  OutPoint *in_RDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  uint32_t index;
  OutPoint outpoint;
  CfdCapiPsbtHandle *psbt_obj;
  int result;
  int64_t *in_stack_000008e0;
  uint32_t *in_stack_000008e8;
  char **in_stack_000008f0;
  uint32_t in_stack_000008fc;
  void *in_stack_00000900;
  void *in_stack_00000908;
  char **in_stack_00000920;
  char **in_stack_00000928;
  char **in_stack_00000930;
  char **in_stack_00000938;
  string *in_stack_fffffffffffffe10;
  CfdError in_stack_fffffffffffffe1c;
  CfdException *in_stack_fffffffffffffe20;
  Psbt *this;
  allocator<char> local_169;
  string local_168;
  Txid local_148;
  OutPoint local_128;
  undefined1 local_fa;
  allocator local_f9;
  string *in_stack_ffffffffffffff08;
  void *in_stack_ffffffffffffff10;
  CfdSourceLocation local_d8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  long local_80;
  allocator local_71;
  string local_70 [52];
  undefined4 local_3c;
  uint32_t local_24;
  OutPoint *local_20;
  long local_18;
  int local_4;
  
  local_3c = 0xffffffff;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"PsbtHandle",&local_71);
  cfd::capi::CheckBuffer(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_80 = local_18;
  bVar1 = cfd::capi::IsEmptyString((char *)local_20);
  if (bVar1) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0x470;
    local_98.funcname = "CfdGetPsbtUtxoData";
    cfd::core::logger::warn<>(&local_98,"txid is null or empty.");
    local_ba = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"Failed to parameter. txid is null or empty.",&local_b9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe10);
    local_ba = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(local_80 + 0x18) == 0) {
    local_d8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_d8.filename = local_d8.filename + 1;
    local_d8.line = 0x476;
    local_d8.funcname = "CfdGetPsbtUtxoData";
    cfd::core::logger::warn<>(&local_d8,"psbt is null.");
    local_fa = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff08,"Failed to handle statement. psbt is null.",
               &local_f9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe10);
    local_fa = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  this = (Psbt *)&local_169;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,(char *)local_20,(allocator *)this);
  cfd::core::Txid::Txid(&local_148,&local_168);
  cfd::core::OutPoint::OutPoint(&local_128,&local_148,local_24);
  cfd::core::Txid::~Txid((Txid *)0x5f1c67);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  cfd::Psbt::GetTxInIndex(this,local_20);
  local_4 = CfdGetPsbtUtxoDataByIndex
                      (in_stack_00000908,in_stack_00000900,in_stack_000008fc,in_stack_000008f0,
                       in_stack_000008e8,in_stack_000008e0,in_stack_00000920,in_stack_00000928,
                       in_stack_00000930,in_stack_00000938);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x5f1d27);
  return local_4;
}

Assistant:

int CfdGetPsbtUtxoData(
    void* handle, void* psbt_handle, const char* txid, uint32_t vout,
    int64_t* amount, char** locking_script, char** redeem_script,
    char** descriptor, char** full_tx_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }
    OutPoint outpoint(Txid(txid), vout);
    uint32_t index = psbt_obj->psbt->GetTxInIndex(outpoint);

    return CfdGetPsbtUtxoDataByIndex(
        handle, psbt_handle, index, nullptr, nullptr, amount, locking_script,
        redeem_script, descriptor, full_tx_hex);
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}